

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * tokenExpr(Parse *pParse,int op,Token t)

{
  Expr *p;
  ulong __n;
  Token local_38;
  
  local_38.n = t.n;
  __n = (ulong)local_38.n;
  local_38.z = t.z;
  p = (Expr *)sqlite3DbMallocRawNN(pParse->db,__n + 0x49);
  if (p != (Expr *)0x0) {
    p->op = (u8)op;
    p->affExpr = '\0';
    p->op2 = '\0';
    p->flags = 0x800000;
    p->iTable = 0;
    p->iColumn = 0;
    (p->x).pList = (ExprList *)0x0;
    p->pLeft = (Expr *)0x0;
    p->pRight = (Expr *)0x0;
    p->pAggInfo = (AggInfo *)0x0;
    (p->y).pTab = (Table *)0x0;
    (p->u).zToken = (char *)(p + 1);
    memcpy(p + 1,t.z,__n);
    (&p[1].op)[__n] = '\0';
    (p->w).iJoin = (int)t.z - *(int *)&pParse->zTail;
    if ((char)""[p[1].op] < '\0') {
      sqlite3DequoteExpr(p);
    }
    p->nHeight = 1;
    if (1 < pParse->eParseMode) {
      sqlite3RenameTokenMap(pParse,p,&local_38);
    }
  }
  return p;
}

Assistant:

static Expr *tokenExpr(Parse *pParse, int op, Token t){
    Expr *p = sqlite3DbMallocRawNN(pParse->db, sizeof(Expr)+t.n+1);
    if( p ){
      /* memset(p, 0, sizeof(Expr)); */
      p->op = (u8)op;
      p->affExpr = 0;
      p->flags = EP_Leaf;
      ExprClearVVAProperties(p);
      /* p->iAgg = -1; // Not required */
      p->pLeft = p->pRight = 0;
      p->pAggInfo = 0;
      memset(&p->x, 0, sizeof(p->x));
      memset(&p->y, 0, sizeof(p->y));
      p->op2 = 0;
      p->iTable = 0;
      p->iColumn = 0;
      p->u.zToken = (char*)&p[1];
      memcpy(p->u.zToken, t.z, t.n);
      p->u.zToken[t.n] = 0;
      p->w.iOfst = (int)(t.z - pParse->zTail);
      if( sqlite3Isquote(p->u.zToken[0]) ){
        sqlite3DequoteExpr(p);
      }
#if SQLITE_MAX_EXPR_DEPTH>0
      p->nHeight = 1;
#endif
      if( IN_RENAME_OBJECT ){
        return (Expr*)sqlite3RenameTokenMap(pParse, (void*)p, &t);
      }
    }
    return p;
  }